

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O3

void duckdb::
     LeastGreatestFunction<duckdb::hugeint_t,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  pointer pVVar1;
  pointer pVVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  ulong uVar6;
  long lVar7;
  reference pvVar8;
  ulong uVar9;
  VectorType vector_type_p;
  long *plVar10;
  ulong uVar11;
  ulong uVar12;
  size_type sVar13;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  UnifiedVectorFormat local_880;
  bool local_838 [2056];
  
  pVVar1 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pVVar2 - (long)pVVar1 == 0x68) {
    pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    Vector::Reference(result,pvVar8);
    return;
  }
  if (pVVar2 == pVVar1) {
    switchD_01043a80::default(local_838,0,0x800);
    vector_type_p = CONSTANT_VECTOR;
  }
  else {
    vector_type_p = CONSTANT_VECTOR;
    sVar13 = 0;
    do {
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar13);
      if (pvVar8->vector_type != CONSTANT_VECTOR) {
        vector_type_p = FLAT_VECTOR;
      }
      sVar13 = sVar13 + 1;
      pVVar1 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (sVar13 < (ulong)(((long)pVVar2 - (long)pVVar1 >> 3) * 0x4ec4ec4ec4ec4ec5));
    pdVar3 = result->data;
    switchD_01043a80::default(local_838,0,0x800);
    if (pVVar2 != pVVar1) {
      sVar13 = 0;
      do {
        pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar13);
        if (pvVar8->vector_type == CONSTANT_VECTOR) {
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar13);
          puVar4 = (pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) goto LAB_01a66d9b;
        }
        else {
LAB_01a66d9b:
          UnifiedVectorFormat::UnifiedVectorFormat(&local_880);
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar13);
          Vector::ToUnifiedFormat(pvVar8,args->count,&local_880);
          uVar9 = args->count;
          if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (uVar9 != 0) {
              psVar5 = (local_880.sel)->sel_vector;
              uVar11 = 0;
              plVar10 = (long *)(pdVar3 + 8);
              do {
                uVar12 = uVar11;
                if (psVar5 != (sel_t *)0x0) {
                  uVar12 = (ulong)psVar5[uVar11];
                }
                uVar6 = *(ulong *)(local_880.data + uVar12 * 0x10);
                lVar7 = *(long *)(local_880.data + uVar12 * 0x10 + 8);
                if (local_838[uVar11] == true) {
                  if ((lVar7 < *plVar10) || (uVar6 < (ulong)plVar10[-1] && *plVar10 == lVar7))
                  goto LAB_01a66ebe;
                }
                else {
LAB_01a66ebe:
                  local_838[uVar11] = true;
                  plVar10[-1] = uVar6;
                  *plVar10 = lVar7;
                  uVar9 = args->count;
                }
                uVar11 = uVar11 + 1;
                plVar10 = plVar10 + 2;
              } while (uVar11 < uVar9);
            }
          }
          else if (uVar9 != 0) {
            psVar5 = (local_880.sel)->sel_vector;
            uVar11 = 0;
            plVar10 = (long *)(pdVar3 + 8);
            do {
              uVar12 = uVar11;
              if (psVar5 != (sel_t *)0x0) {
                uVar12 = (ulong)psVar5[uVar11];
              }
              if ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0) {
                uVar6 = *(ulong *)(local_880.data + uVar12 * 0x10);
                lVar7 = *(long *)(local_880.data + uVar12 * 0x10 + 8);
                if (local_838[uVar11] == true) {
                  if ((*plVar10 <= lVar7) && ((ulong)plVar10[-1] <= uVar6 || *plVar10 != lVar7))
                  goto LAB_01a66e56;
                }
                local_838[uVar11] = true;
                plVar10[-1] = uVar6;
                *plVar10 = lVar7;
                uVar9 = args->count;
              }
LAB_01a66e56:
              uVar11 = uVar11 + 1;
              plVar10 = plVar10 + 2;
            } while (uVar11 < uVar9);
          }
          if (local_880.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_880.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        sVar13 = sVar13 + 1;
      } while (sVar13 < (ulong)(((long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
  }
  StandardLeastGreatest<false>::FinalizeResult(args->count,local_838,result,state);
  Vector::SetVectorType(result,vector_type_p);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}